

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * jx9_new_scalar(jx9_vm *pVm)

{
  jx9_value *pObj;
  jx9_vm *pVm_local;
  
  if ((pVm == (jx9_vm *)0x0) || (pVm->nMagic == 0xdead2bad)) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    pVm_local = (jx9_vm *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x40);
    if (pVm_local == (jx9_vm *)0x0) {
      pVm_local = (jx9_vm *)0x0;
    }
    else {
      jx9MemObjInit(pVm,(jx9_value *)pVm_local);
    }
  }
  return (jx9_value *)pVm_local;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_new_scalar(jx9_vm *pVm)
{
	jx9_value *pObj;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return 0;
	}
	/* Allocate a new scalar variable */
	pObj = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_value));
	if( pObj == 0 ){
		return 0;
	}
	/* Nullify the new scalar */
	jx9MemObjInit(pVm, pObj);
	return pObj;
}